

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianPlumeRecord.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::GaussianPlumeRecord::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GaussianPlumeRecord *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_260;
  KString local_240;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  EnvironmentRecord::GetAsString_abi_cxx11_(&local_1c0,&this->super_EnvironmentRecord);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tLocation:                     ",0x1f)
  ;
  WorldCoordinates::GetAsString_abi_cxx11_(&local_1e0,&this->m_SrcLocation);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tOrientation:                  ",0x1f)
  ;
  EulerAngles::GetAsString_abi_cxx11_(&local_200,&this->m_Ori);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_200._M_dataplus._M_p,local_200._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tPlume Length, Width, Height:  ",0x1f)
  ;
  Vector::GetAsString_abi_cxx11_(&local_220,&this->m_PlumeLWH);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_220._M_dataplus._M_p,local_220._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\td/dt:                         ",0x1f)
  ;
  Vector::GetAsString_abi_cxx11_(&local_240,&this->m_DDTLEH);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_240._M_dataplus._M_p,local_240._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tLeading Edge Centroid Height: ",0x1f)
  ;
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32LdEdgeCenHght);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tLeading Edge Velocity:        ",0x1f)
  ;
  Vector::GetAsString_abi_cxx11_(&local_260,&this->m_LdEdgeVel);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_260._M_dataplus._M_p,local_260._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString GaussianPlumeRecord::GetAsString() const
{
    KStringStream ss;

    ss << EnvironmentRecord::GetAsString()
       << "\tLocation:                     " << m_SrcLocation.GetAsString()
       << "\tOrientation:                  " << m_Ori.GetAsString()
       << "\tPlume Length, Width, Height:  " << m_PlumeLWH.GetAsString()
       << "\td/dt:                         " << m_DDTLEH.GetAsString()
       << "\tLeading Edge Centroid Height: " << m_f32LdEdgeCenHght << "\n"
       << "\tLeading Edge Velocity:        " << m_LdEdgeVel.GetAsString();

    return ss.str();
}